

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt,xmlSBuf *buf,xmlChar *str,int length,int depth)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlEntityPtr entity;
  byte *pbVar6;
  xmlEntityPtr ent;
  xmlChar *name;
  int l;
  int c;
  xmlChar *chunk;
  xmlChar *end;
  int maxDepth;
  int depth_local;
  int length_local;
  xmlChar *str_local;
  xmlSBuf *buf_local;
  xmlParserCtxtPtr ctxt_local;
  
  iVar4 = 0x14;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar4 = 0x28;
  }
  if (str != (xmlChar *)0x0) {
    _depth_local = str;
    str_local = (xmlChar *)buf;
    buf_local = (xmlSBuf *)ctxt;
    if (iVar4 < depth + 1) {
      xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,"Maximum entity nesting depth exceeded");
    }
    else {
      _l = str;
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              bVar2 = false;
              if (_depth_local < str + length) {
                bVar2 = (int)buf_local[0xd].code < 2;
              }
              iVar3 = (int)_l;
              iVar4 = (int)_depth_local;
              if (!bVar2) {
                if (_depth_local <= _l) {
                  return;
                }
                xmlSBufAddString((xmlSBuf *)str_local,_l,iVar4 - iVar3);
                return;
              }
              bVar1 = *_depth_local;
              if (bVar1 < 0x80) break;
              iVar4 = xmlUTF8MultibyteLen((xmlParserCtxtPtr)buf_local,_depth_local,
                                          "invalid character in entity value\n");
              if (iVar4 == 0) {
                if (_l < _depth_local) {
                  xmlSBufAddString((xmlSBuf *)str_local,_l,(int)_depth_local - iVar3);
                }
                xmlSBufAddReplChar((xmlSBuf *)str_local);
                _l = _depth_local + 1;
                _depth_local = _l;
              }
              else {
                _depth_local = _depth_local + iVar4;
              }
            }
            if (bVar1 != 0x26) break;
            if (_depth_local[1] == 0x23) {
              if (_l < _depth_local) {
                xmlSBufAddString((xmlSBuf *)str_local,_l,iVar4 - iVar3);
              }
              iVar4 = xmlParseStringCharRef((xmlParserCtxtPtr)buf_local,(xmlChar **)&depth_local);
              if (iVar4 == 0) {
                return;
              }
              xmlSBufAddChar((xmlSBuf *)str_local,iVar4);
              _l = _depth_local;
            }
            else {
              _depth_local = _depth_local + 1;
              pxVar5 = xmlParseStringName((xmlParserCtxtPtr)buf_local,(xmlChar **)&depth_local);
              if ((pxVar5 == (xmlChar *)0x0) ||
                 (pbVar6 = _depth_local + 1, bVar1 = *_depth_local, _depth_local = pbVar6,
                 bVar1 != 0x3b)) {
                xmlFatalErrMsg((xmlParserCtxtPtr)buf_local,XML_ERR_ENTITY_CHAR_ERROR,
                               "EntityValue: \'&\' forbidden except for entities references\n");
                (*xmlFree)(pxVar5);
                return;
              }
              (*xmlFree)(pxVar5);
            }
          }
          if (bVar1 == 0x25) break;
          if ((((bVar1 < 9) || (10 < bVar1)) && (bVar1 != 0xd)) && (bVar1 < 0x20)) {
            xmlFatalErrMsg((xmlParserCtxtPtr)buf_local,XML_ERR_INVALID_CHAR,
                           "invalid character in entity value\n");
            if (_l < _depth_local) {
              xmlSBufAddString((xmlSBuf *)str_local,_l,(int)_depth_local - iVar3);
            }
            xmlSBufAddReplChar((xmlSBuf *)str_local);
            _l = _depth_local + 1;
            _depth_local = _l;
          }
          else {
            _depth_local = _depth_local + 1;
          }
        }
        if (_l < _depth_local) {
          xmlSBufAddString((xmlSBuf *)str_local,_l,iVar4 - iVar3);
        }
        entity = xmlParseStringPEReference((xmlParserCtxtPtr)buf_local,(xmlChar **)&depth_local);
        if (entity == (xmlEntityPtr)0x0) {
          return;
        }
        if ((*(int *)&buf_local[0xe].mem != 2) &&
           ((*(long *)(*(long *)&buf_local[2].size + 0x70) == 0 ||
            (*(int *)(*(long *)(*(long *)&buf_local[2].size + 0x70) + 0x5c) != 5)))) {
          xmlFatalErr((xmlParserCtxtPtr)buf_local,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
          return;
        }
        if (entity->content == (xmlChar *)0x0) {
          if (((buf_local[0x17].cap & 0x800000) == 0) &&
             ((*(int *)((long)&buf_local[1].mem + 4) != 0 || (buf_local[6].cap != 0)))) {
            xmlLoadEntityContent((xmlParserCtxtPtr)buf_local,entity);
          }
          else {
            xmlWarningMsg((xmlParserCtxtPtr)buf_local,XML_ERR_ENTITY_PROCESSING,
                          "not validating will not read content for PE entity %s\n",entity->name,
                          (xmlChar *)0x0);
          }
        }
        iVar4 = xmlParserEntityCheck((xmlParserCtxtPtr)buf_local,(long)entity->length);
        if (iVar4 != 0) {
          return;
        }
        if ((entity->flags & 8U) != 0) break;
        entity->flags = entity->flags | 8;
        xmlExpandPEsInEntityValue
                  ((xmlParserCtxtPtr)buf_local,(xmlSBuf *)str_local,entity->content,entity->length,
                   depth + 1);
        entity->flags = entity->flags & 0xfffffff7;
        _l = _depth_local;
      }
      xmlFatalErr((xmlParserCtxtPtr)buf_local,XML_ERR_ENTITY_LOOP,(char *)0x0);
      xmlHaltParser((xmlParserCtxtPtr)buf_local);
    }
  }
  return;
}

Assistant:

static void
xmlExpandPEsInEntityValue(xmlParserCtxtPtr ctxt, xmlSBuf *buf,
                          const xmlChar *str, int length, int depth) {
    int maxDepth = (ctxt->options & XML_PARSE_HUGE) ? 40 : 20;
    const xmlChar *end, *chunk;
    int c, l;

    if (str == NULL)
        return;

    depth += 1;
    if (depth > maxDepth) {
	xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                       "Maximum entity nesting depth exceeded");
	return;
    }

    end = str + length;
    chunk = str;

    while ((str < end) && (!PARSER_STOPPED(ctxt))) {
        c = *str;

        if (c >= 0x80) {
            l = xmlUTF8MultibyteLen(ctxt, str,
                    "invalid character in entity value\n");
            if (l == 0) {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += l;
            }
        } else if (c == '&') {
            if (str[1] == '#') {
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);

                c = xmlParseStringCharRef(ctxt, &str);
                if (c == 0)
                    return;

                xmlSBufAddChar(buf, c);

                chunk = str;
            } else {
                xmlChar *name;

                /*
                 * General entity references are checked for
                 * syntactic validity.
                 */
                str++;
                name = xmlParseStringName(ctxt, &str);

                if ((name == NULL) || (*str++ != ';')) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
                            "EntityValue: '&' forbidden except for entities "
                            "references\n");
                    xmlFree(name);
                    return;
                }

                xmlFree(name);
            }
        } else if (c == '%') {
            xmlEntityPtr ent;

            if (chunk < str)
                xmlSBufAddString(buf, chunk, str - chunk);

            ent = xmlParseStringPEReference(ctxt, &str);
            if (ent == NULL)
                return;

            if (!PARSER_EXTERNAL(ctxt)) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                return;
            }

            if (ent->content == NULL) {
                /*
                 * Note: external parsed entities will not be loaded,
                 * it is not required for a non-validating parser to
                 * complete external PEReferences coming from the
                 * internal subset
                 */
                if (((ctxt->options & XML_PARSE_NO_XXE) == 0) &&
                    ((ctxt->replaceEntities) ||
                     (ctxt->validate))) {
                    xmlLoadEntityContent(ctxt, ent);
                } else {
                    xmlWarningMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
                                  "not validating will not read content for "
                                  "PE entity %s\n", ent->name, NULL);
                }
            }

            /*
             * TODO: Skip if ent->content is still NULL.
             */

            if (xmlParserEntityCheck(ctxt, ent->length))
                return;

            if (ent->flags & XML_ENT_EXPANDING) {
                xmlFatalErr(ctxt, XML_ERR_ENTITY_LOOP, NULL);
                xmlHaltParser(ctxt);
                return;
            }

            ent->flags |= XML_ENT_EXPANDING;
            xmlExpandPEsInEntityValue(ctxt, buf, ent->content, ent->length,
                                      depth);
            ent->flags &= ~XML_ENT_EXPANDING;

            chunk = str;
        } else {
            /* Normal ASCII char */
            if (!IS_BYTE_CHAR(c)) {
                xmlFatalErrMsg(ctxt, XML_ERR_INVALID_CHAR,
                        "invalid character in entity value\n");
                if (chunk < str)
                    xmlSBufAddString(buf, chunk, str - chunk);
                xmlSBufAddReplChar(buf);
                str += 1;
                chunk = str;
            } else {
                str += 1;
            }
        }
    }

    if (chunk < str)
        xmlSBufAddString(buf, chunk, str - chunk);
}